

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataControllerInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::init_data(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataControllerInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,size_t max_elements)

{
  undefined1 auVar1 [16];
  Node *pNVar2;
  size_t maxNumElementsAllowed;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  this->mNumElements = 0;
  this->mMask = max_elements - 1;
  if (max_elements < 0x28f5c28f5c28f5d) {
    uVar3 = (max_elements * 0x50) / 100;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = max_elements >> 2;
    uVar3 = (SUB168(auVar1 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0x3ffffffffffffffc) * 0x14;
  }
  uVar4 = 0xff;
  if (uVar3 < 0xff) {
    uVar4 = uVar3;
  }
  this->mMaxNumElementsAllowed = uVar3;
  lVar5 = uVar4 + max_elements;
  pNVar2 = (Node *)calloc(1,lVar5 * 0x29 + 8);
  if (pNVar2 != (Node *)0x0) {
    this->mKeyVals = pNVar2;
    this->mInfo = (uint8_t *)(pNVar2 + lVar5);
    *(undefined1 *)((long)&pNVar2[lVar5].mData.first._M_dataplus._M_p + lVar5) = 1;
    this->mInfoInc = 0x20;
    this->mInfoHashShift = 0;
    return;
  }
  doThrow<std::bad_alloc>();
}

Assistant:

void init_data(size_t max_elements) {
        mNumElements = 0;
        mMask = max_elements - 1;
        mMaxNumElementsAllowed = calcMaxNumElementsAllowed(max_elements);

        auto const numElementsWithBuffer = calcNumElementsWithBuffer(max_elements);

        // calloc also zeroes everything
        mKeyVals = reinterpret_cast<Node*>(detail::assertNotNull<std::bad_alloc>(
            std::calloc(1, calcNumBytesTotal(numElementsWithBuffer))));
        mInfo = reinterpret_cast<uint8_t*>(mKeyVals + numElementsWithBuffer);

        // set sentinel
        mInfo[numElementsWithBuffer] = 1;

        mInfoInc = InitialInfoInc;
        mInfoHashShift = InitialInfoHashShift;
    }